

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void phmap::priv::(anonymous_namespace)::
     BtreeAllocatorTest<phmap::btree_set<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>>>
               (void)

{
  bool bVar1;
  pointer p;
  char *pcVar2;
  AssertHelper local_450;
  Message local_448;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_13;
  int local_418;
  int local_414;
  int i_2;
  Message local_408;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_12;
  Message local_3e8;
  int local_3dc;
  size_type local_3d8;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_11;
  Message local_3b8;
  int local_3ac;
  size_type local_3a8;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_10;
  Message local_388;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_9;
  int local_354;
  int64_t local_350;
  int64_t original_bytes1_2;
  key_compare local_339;
  undefined1 local_338 [8];
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  b2_2;
  key_compare local_309;
  undefined1 local_308 [8];
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  b1_2;
  Message local_2e0;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_8;
  int local_2b0;
  int local_2ac;
  int i_1;
  Message local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_7;
  Message local_280;
  int local_274;
  size_type local_270;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_6;
  Message local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_5;
  int local_21c;
  int64_t local_218;
  int64_t original_bytes1_1;
  key_compare local_201;
  undefined1 local_200 [8];
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  b2_1;
  key_compare local_1d1;
  undefined1 local_1d0 [8];
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  b1_1;
  Message local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_4;
  int local_178;
  int local_174;
  int i;
  Message local_168;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_3;
  Message local_148;
  int local_13c;
  size_type local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_2;
  Message local_118;
  int local_10c;
  size_type local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  Message local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  int local_b4;
  int64_t local_b0;
  int64_t original_bytes1;
  key_compare local_99;
  undefined1 local_98 [8];
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  b2;
  key_compare local_69;
  undefined1 local_68 [8];
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  b1;
  pointer unused2;
  pointer unused1;
  Generator<int> generator;
  CountingAllocator<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
  local_28;
  PropagatingCountingAlloc<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
  allocator2;
  PropagatingCountingAlloc<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
  allocator1;
  int64_t bytes2;
  int64_t bytes1;
  
  bytes2 = 0;
  allocator1.
  super_CountingAllocator<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
  .bytes_used_ = (CountingAllocator<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
                  )(int64_t *)0x0;
  anon_unknown_0::
  PropagatingCountingAlloc<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
  ::CountingAllocator(&allocator2,&bytes2);
  anon_unknown_0::
  PropagatingCountingAlloc<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
  ::CountingAllocator((PropagatingCountingAlloc<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
                       *)&local_28,(int64_t *)&allocator1);
  Generator<int>::Generator((Generator<int> *)&unused1,1000);
  p = CountingAllocator<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
      ::allocate(&allocator2.
                  super_CountingAllocator<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
                 ,1,(const_pointer)0x0);
  b1.
  super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
  .tree_.size_ = (size_type)
                 CountingAllocator<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
                 ::allocate(&local_28,1,(const_pointer)0x0);
  PropagatingCountingAlloc<int>::
  CountingAllocator<phmap::btree_set<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>>>
            ((PropagatingCountingAlloc<int> *)
             &b2.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              .tree_.size_,
             &allocator2.
              super_CountingAllocator<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
            );
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  ::btree_container((btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
                     *)local_68,&local_69,
                    (allocator_type *)
                    &b2.
                     super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                     .
                     super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                     .tree_.size_);
  anon_unknown_0::PropagatingCountingAlloc<int>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<int> *)
             &b2.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              .tree_.size_);
  PropagatingCountingAlloc<int>::
  CountingAllocator<phmap::btree_set<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>>>
            ((PropagatingCountingAlloc<int> *)&original_bytes1,&local_28);
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  ::btree_container((btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
                     *)local_98,&local_99,(allocator_type *)&original_bytes1);
  anon_unknown_0::PropagatingCountingAlloc<int>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<int> *)&original_bytes1);
  local_b0 = bytes2;
  local_b4 = Generator<int>::operator()((Generator<int> *)&unused1,0);
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>,_int_&,_int_*>,_bool>
            *)&gtest_ar.message_,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
            *)local_68,&local_b4);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_e0,"bytes1","original_bytes1",&bytes2,&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2be,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  ::operator=((btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
               *)local_68,
              (btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
               *)local_98);
  local_108 = btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              ::size((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                      *)local_68);
  local_10c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_100,"b1.size()","0",&local_108,&local_10c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_138 = btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              ::size((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                      *)local_98);
  local_13c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_130,"b2.size()","0",&local_138,&local_13c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_160,"bytes1","original_bytes1",&bytes2,&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2c4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffe90,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe90);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  for (local_174 = 1; local_174 < 1000; local_174 = local_174 + 1) {
    local_178 = Generator<int>::operator()((Generator<int> *)&unused1,local_174);
    btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>,_int_&,_int_*>,_bool>
              *)&gtest_ar_4.message_,
             (btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              *)local_68,&local_178);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_1a0,"bytes2","bytes1",(long *)&allocator1,&bytes2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &b1_1.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                .tree_.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2cb,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &b1_1.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                .tree_.size_,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &b1_1.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                .tree_.size_);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  ::~btree_set((btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
                *)local_98);
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  ::~btree_set((btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
                *)local_68);
  PropagatingCountingAlloc<int>::
  CountingAllocator<phmap::btree_set<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>>>
            ((PropagatingCountingAlloc<int> *)
             &b2_1.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              .tree_.size_,
             &allocator2.
              super_CountingAllocator<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
            );
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  ::btree_container((btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
                     *)local_1d0,&local_1d1,
                    (allocator_type *)
                    &b2_1.
                     super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                     .
                     super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                     .tree_.size_);
  anon_unknown_0::PropagatingCountingAlloc<int>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<int> *)
             &b2_1.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              .tree_.size_);
  PropagatingCountingAlloc<int>::
  CountingAllocator<phmap::btree_set<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>>>
            ((PropagatingCountingAlloc<int> *)&original_bytes1_1,&local_28);
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  ::btree_container((btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
                     *)local_200,&local_201,(allocator_type *)&original_bytes1_1);
  anon_unknown_0::PropagatingCountingAlloc<int>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<int> *)&original_bytes1_1);
  local_218 = bytes2;
  local_21c = Generator<int>::operator()((Generator<int> *)&unused1,0);
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>,_int_&,_int_*>,_bool>
            *)&gtest_ar_5.message_,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
            *)local_1d0,&local_21c);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_248,"bytes1","original_bytes1",&bytes2,&local_218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  ::operator=((btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
               *)local_1d0,
              (btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
               *)local_200);
  local_270 = btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              ::size((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                      *)local_1d0);
  local_274 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_268,"b1.size()","0",&local_270,&local_274);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2d9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_298,"bytes1","original_bytes1",&bytes2,&local_218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffd58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2da,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffd58,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd58);
    testing::Message::~Message(&local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  for (local_2ac = 1; local_2ac < 1000; local_2ac = local_2ac + 1) {
    local_2b0 = Generator<int>::operator()((Generator<int> *)&unused1,local_2ac);
    btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>,_int_&,_int_*>,_bool>
              *)&gtest_ar_8.message_,
             (btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              *)local_1d0,&local_2b0);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_2d8,"bytes2","bytes1",(long *)&allocator1,&bytes2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &b1_2.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                .tree_.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2e1,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &b1_2.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                .tree_.size_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &b1_2.
                super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                .
                super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                .tree_.size_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  ::~btree_set((btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
                *)local_200);
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  ::~btree_set((btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
                *)local_1d0);
  PropagatingCountingAlloc<int>::
  CountingAllocator<phmap::btree_set<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>>>
            ((PropagatingCountingAlloc<int> *)
             &b2_2.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              .tree_.size_,
             &allocator2.
              super_CountingAllocator<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
            );
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  ::btree_container((btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
                     *)local_308,&local_309,
                    (allocator_type *)
                    &b2_2.
                     super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                     .
                     super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                     .tree_.size_);
  anon_unknown_0::PropagatingCountingAlloc<int>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<int> *)
             &b2_2.
              super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              .tree_.size_);
  PropagatingCountingAlloc<int>::
  CountingAllocator<phmap::btree_set<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>>>
            ((PropagatingCountingAlloc<int> *)&original_bytes1_2,&local_28);
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  ::btree_container((btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
                     *)local_338,&local_339,(allocator_type *)&original_bytes1_2);
  anon_unknown_0::PropagatingCountingAlloc<int>::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<int> *)&original_bytes1_2);
  local_350 = bytes2;
  local_354 = Generator<int>::operator()((Generator<int> *)&unused1,0);
  btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
  ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>,_int_&,_int_*>,_bool>
            *)&gtest_ar_9.message_,
           (btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
            *)local_308,&local_354);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_380,"bytes1","original_bytes1",&bytes2,&local_350);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2eb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  swap<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>>
            ((btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
              *)local_308,
             (btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
              *)local_338);
  local_3a8 = btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              ::size((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                      *)local_308);
  local_3ac = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3a0,"b1.size()","0",&local_3a8,&local_3ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2ef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  local_3d8 = btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              ::size((btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                      *)local_338);
  local_3dc = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3d0,"b2.size()","1",&local_3d8,&local_3dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_3e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_400,"bytes1","original_bytes1",&bytes2,&local_350);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffbf0,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbf0);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  for (local_414 = 1; local_414 < 1000; local_414 = local_414 + 1) {
    local_418 = Generator<int>::operator()((Generator<int> *)&unused1,local_414);
    btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>,_int_&,_int_*>,_bool>
              *)&gtest_ar_13.message_,
             (btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
              *)local_308,&local_418);
  }
  testing::internal::CmpHelperGT<long,long>
            ((internal *)local_440,"bytes2","bytes1",(long *)&allocator1,&bytes2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_448);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              (&local_450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x2f8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_450,&local_448);
    testing::internal::AssertHelper::~AssertHelper(&local_450);
    testing::Message::~Message(&local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  ::~btree_set((btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
                *)local_338);
  btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
  ::~btree_set((btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>
                *)local_308);
  CountingAllocator<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
  ::deallocate(&allocator2.
                super_CountingAllocator<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
               ,p,1);
  CountingAllocator<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
  ::deallocate(&local_28,
               (pointer)b1.
                        super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                        .
                        super_btree_container<phmap::priv::btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>_>
                        .tree_.size_,1);
  anon_unknown_0::
  PropagatingCountingAlloc<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
  ::~PropagatingCountingAlloc
            ((PropagatingCountingAlloc<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
              *)&local_28);
  anon_unknown_0::
  PropagatingCountingAlloc<phmap::btree_set<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>_>_>
  ::~PropagatingCountingAlloc(&allocator2);
  return;
}

Assistant:

void BtreeAllocatorTest() {
        using value_type = typename T::value_type;

        int64_t bytes1 = 0, bytes2 = 0;
        PropagatingCountingAlloc<T> allocator1(&bytes1);
        PropagatingCountingAlloc<T> allocator2(&bytes2);
        Generator<value_type> generator(1000);

        // Test that we allocate properly aligned memory. If we don't, then Layout
        // will assert fail.
        auto unused1 = allocator1.allocate(1);
        auto unused2 = allocator2.allocate(1);

        // Test copy assignment
        {
            T b1(typename T::key_compare(), allocator1);
            T b2(typename T::key_compare(), allocator2);

            int64_t original_bytes1 = bytes1;
            b1.insert(generator(0));
            EXPECT_GT(bytes1, original_bytes1);

            // This should propagate the allocator.
            b1 = b2;
            EXPECT_EQ(b1.size(), 0);
            EXPECT_EQ(b2.size(), 0);
            EXPECT_EQ(bytes1, original_bytes1);

            for (int i = 1; i < 1000; i++) {
                b1.insert(generator(i));
            }

            // We should have allocated out of allocator2.
            EXPECT_GT(bytes2, bytes1);
        }

        // Test move assignment
        {
            T b1(typename T::key_compare(), allocator1);
            T b2(typename T::key_compare(), allocator2);

            int64_t original_bytes1 = bytes1;
            b1.insert(generator(0));
            EXPECT_GT(bytes1, original_bytes1);

            // This should propagate the allocator.
            b1 = std::move(b2);
            EXPECT_EQ(b1.size(), 0);
            EXPECT_EQ(bytes1, original_bytes1);

            for (int i = 1; i < 1000; i++) {
                b1.insert(generator(i));
            }

            // We should have allocated out of allocator2.
            EXPECT_GT(bytes2, bytes1);
        }

        // Test swap
        {
            T b1(typename T::key_compare(), allocator1);
            T b2(typename T::key_compare(), allocator2);

            int64_t original_bytes1 = bytes1;
            b1.insert(generator(0));
            EXPECT_GT(bytes1, original_bytes1);

            // This should swap the allocators.
            swap(b1, b2);
            EXPECT_EQ(b1.size(), 0);
            EXPECT_EQ(b2.size(), 1);
            EXPECT_GT(bytes1, original_bytes1);

            for (int i = 1; i < 1000; i++) {
                b1.insert(generator(i));
            }

            // We should have allocated out of allocator2.
            EXPECT_GT(bytes2, bytes1);
        }

        allocator1.deallocate(unused1, 1);
        allocator2.deallocate(unused2, 1);
    }